

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O0

Ssh_gss_stat ssh_gssapi_acquire_cred(ssh_gss_library *lib,Ssh_gss_ctx *ctx,time_t *expiry)

{
  int iVar1;
  int *ptr;
  time_t tVar2;
  gssapi_ssh_gss_ctx *gssctx;
  OM_uint32 time_rec;
  OM_uint32 dummy;
  gss_cred_id_t cred;
  gss_OID_set_desc k5only;
  gssapi_functions *gss;
  time_t *expiry_local;
  Ssh_gss_ctx *ctx_local;
  ssh_gss_library *lib_local;
  
  k5only.elements = (gss_OID)&lib->u;
  cred = (gss_cred_id_t)0x1;
  k5only.count = (size_t)&gss_mech_krb5_desc;
  ptr = (int *)safemalloc(1,0x18,0);
  ptr[2] = 0;
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  iVar1 = (*(code *)k5only.elements[4].elements)(ptr + 1,0,0xffffffff,&cred,1,&time_rec,0,&gssctx);
  *ptr = iVar1;
  if (*ptr == 0) {
    if (((uint)gssctx == 0xffffffff) || ((uint)gssctx == 0)) {
      iVar1 = (**(code **)(k5only.elements + 5))
                        (ptr + 1,_time_rec,&gss_mech_krb5_desc,0,&gssctx,0,0);
      *ptr = iVar1;
    }
    (*(code *)k5only.elements[3].elements)((long)&gssctx + 4,&time_rec);
    if (*ptr == 0) {
      if ((uint)gssctx == 0xffffffff) {
        ptr[4] = -1;
        ptr[5] = -1;
      }
      else {
        tVar2 = time((time_t *)0x0);
        *(ulong *)(ptr + 4) = tVar2 + (ulong)(uint)gssctx;
      }
      if (expiry != (time_t *)0x0) {
        *expiry = *(time_t *)(ptr + 4);
      }
      *ctx = ptr;
      lib_local._4_4_ = SSH_GSS_OK;
    }
    else {
      safefree(ptr);
      lib_local._4_4_ = SSH_GSS_FAILURE;
    }
  }
  else {
    safefree(ptr);
    lib_local._4_4_ = SSH_GSS_FAILURE;
  }
  return lib_local._4_4_;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_acquire_cred(struct ssh_gss_library *lib,
                                            Ssh_gss_ctx *ctx,
                                            time_t *expiry)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gss_OID_set_desc k5only = { 1, GSS_MECH_KRB5 };
    gss_cred_id_t cred;
    OM_uint32 dummy;
    OM_uint32 time_rec;
    gssapi_ssh_gss_ctx *gssctx = snew(gssapi_ssh_gss_ctx);

    gssctx->ctx = GSS_C_NO_CONTEXT;
    gssctx->expiry = 0;

    gssctx->maj_stat =
        gss->acquire_cred(&gssctx->min_stat, GSS_C_NO_NAME, GSS_C_INDEFINITE,
                          &k5only, GSS_C_INITIATE, &cred,
                          (gss_OID_set *)0, &time_rec);

    if (gssctx->maj_stat != GSS_S_COMPLETE) {
        sfree(gssctx);
        return SSH_GSS_FAILURE;
    }

    /*
     * When the credential lifetime is not yet available due to deferred
     * processing, gss_acquire_cred should return a 0 lifetime which is
     * distinct from GSS_C_INDEFINITE which signals a crential that never
     * expires.  However, not all implementations get this right, and with
     * Kerberos, initiator credentials always expire at some point.  So when
     * lifetime is 0 or GSS_C_INDEFINITE we call gss_inquire_cred_by_mech() to
     * complete deferred processing.
     */
    if (time_rec == GSS_C_INDEFINITE || time_rec == 0) {
        gssctx->maj_stat =
            gss->inquire_cred_by_mech(&gssctx->min_stat, cred,
                                      (gss_OID) GSS_MECH_KRB5,
                                      GSS_C_NO_NAME,
                                      &time_rec,
                                      NULL,
                                      NULL);
    }
    (void) gss->release_cred(&dummy, &cred);

    if (gssctx->maj_stat != GSS_S_COMPLETE) {
        sfree(gssctx);
        return SSH_GSS_FAILURE;
    }

    if (time_rec != GSS_C_INDEFINITE)
        gssctx->expiry = time(NULL) + time_rec;
    else
        gssctx->expiry = GSS_NO_EXPIRATION;

    if (expiry) {
        *expiry = gssctx->expiry;
    }

    *ctx = (Ssh_gss_ctx) gssctx;
    return SSH_GSS_OK;
}